

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LoadInt32FromUntaggedVar(Lowerer *this,Instr *instrLoad)

{
  Func *func;
  Opnd *pOVar1;
  StackSym *sym;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  LabelInstr *target;
  RegOpnd *pRVar6;
  Instr *instr;
  IntConstOpnd *compareSrc2;
  Lowerer *this_00;
  
  if (instrLoad == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3999,"(instrLoad)","instrLoad");
    if (!bVar3) goto LAB_005e436b;
    *puVar5 = 0;
  }
  if (instrLoad->m_dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x399a,"(instrLoad->GetDst())","instrLoad->GetDst()");
    if (!bVar3) goto LAB_005e436b;
    *puVar5 = 0;
  }
  OVar4 = IR::Opnd::GetKind(instrLoad->m_dst);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x399b,"(instrLoad->GetDst()->IsRegOpnd())",
                       "instrLoad->GetDst()->IsRegOpnd()");
    if (!bVar3) goto LAB_005e436b;
    *puVar5 = 0;
  }
  if (instrLoad->m_dst->m_type != TyInt32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x399c,"(instrLoad->GetDst()->IsInt32())","instrLoad->GetDst()->IsInt32()");
    if (!bVar3) goto LAB_005e436b;
    *puVar5 = 0;
  }
  if (instrLoad->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x399d,"(instrLoad->GetSrc1())","instrLoad->GetSrc1()");
    if (!bVar3) goto LAB_005e436b;
    *puVar5 = 0;
  }
  OVar4 = IR::Opnd::GetKind(instrLoad->m_src1);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x399e,"(instrLoad->GetSrc1()->IsRegOpnd())",
                       "instrLoad->GetSrc1()->IsRegOpnd()");
    if (!bVar3) goto LAB_005e436b;
    *puVar5 = 0;
  }
  if (instrLoad->m_src1->m_type != TyVar) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x399f,"(instrLoad->GetSrc1()->IsVar())","instrLoad->GetSrc1()->IsVar()");
    if (!bVar3) goto LAB_005e436b;
    *puVar5 = 0;
  }
  if (instrLoad->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x39a0,"(!instrLoad->GetSrc2())","!instrLoad->GetSrc2()");
    if (!bVar3) goto LAB_005e436b;
    *puVar5 = 0;
  }
  func = instrLoad->m_func;
  target = IR::Instr::GetOrCreateContinueLabel(instrLoad,false);
  pOVar1 = instrLoad->m_dst;
  OVar4 = IR::Opnd::GetKind(pOVar1);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005e436b;
    *puVar5 = 0;
  }
  sym = (StackSym *)pOVar1[1]._vptr_Opnd;
  pRVar6 = IR::RegOpnd::New(sym,TyInt32,func);
  pOVar1 = instrLoad->m_src1;
  OVar4 = IR::Opnd::GetKind(pOVar1);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
LAB_005e436b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  instr = IR::Instr::New(Call,&pRVar6->super_Opnd,pOVar1,func);
  IR::Instr::InsertBefore(instrLoad,instr);
  LowerUnaryHelper(this,instr,HelperGetNonzeroInt32Value_NoTaggedIntCheck,(Opnd *)0x0);
  pRVar6 = IR::RegOpnd::New(sym,TyInt32,func);
  this_00 = (Lowerer *)0x0;
  compareSrc2 = IR::IntConstOpnd::New(0,TyInt32,func,true);
  InsertCompareBranch(this_00,&pRVar6->super_Opnd,&compareSrc2->super_Opnd,BrNeq_A,false,target,
                      instrLoad,false);
  return;
}

Assistant:

void
Lowerer::LoadInt32FromUntaggedVar(IR::Instr *const instrLoad)
{
    Assert(instrLoad);
    Assert(instrLoad->GetDst());
    Assert(instrLoad->GetDst()->IsRegOpnd());
    Assert(instrLoad->GetDst()->IsInt32());
    Assert(instrLoad->GetSrc1());
    Assert(instrLoad->GetSrc1()->IsRegOpnd());
    Assert(instrLoad->GetSrc1()->IsVar());
    Assert(!instrLoad->GetSrc2());

    //     push src
    //     int32Value = call JavascriptNumber::GetNonzeroInt32Value_NoChecks
    //     test int32Value, int32Value
    //     jne  $done
    //     (fall through to 'instrLoad'; caller will generate code here)
    //   $done:
    //     (rest of program)

    Func *const func = instrLoad->m_func;
    IR::LabelInstr *const doneLabel = instrLoad->GetOrCreateContinueLabel();

    //     push src
    //     int32Value = call JavascriptNumber::GetNonzeroInt32Value_NoChecks
    StackSym *const int32ValueSym = instrLoad->GetDst()->AsRegOpnd()->m_sym;
    IR::Instr *const instr =
        IR::Instr::New(
            Js::OpCode::Call,
            IR::RegOpnd::New(int32ValueSym, TyInt32, func),
            instrLoad->GetSrc1()->AsRegOpnd(),
            func);
    instrLoad->InsertBefore(instr);
    LowerUnaryHelper(instr, IR::HelperGetNonzeroInt32Value_NoTaggedIntCheck);

    //     test int32Value, int32Value
    //     jne  $done
    InsertCompareBranch(
        IR::RegOpnd::New(int32ValueSym, TyInt32, func),
        IR::IntConstOpnd::New(0, TyInt32, func, true),
        Js::OpCode::BrNeq_A,
        doneLabel,
        instrLoad);
}